

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X11MiniFB.c
# Opt level: O3

_Bool mfb_wait_sync(mfb_window *window)

{
  mfb_window mVar1;
  long lVar2;
  int iVar3;
  byte bVar4;
  int iVar5;
  double dVar6;
  XEvent event;
  XEvent local_f0;
  
  if (window == (mfb_window *)0x0) {
    bVar4 = 1;
  }
  else if (window[0x2a2] == (mfb_window)0x1) {
    destroy_window_data((SWindowData *)window);
    bVar4 = 0;
  }
  else {
    lVar2 = *(long *)window;
    XFlush(*(undefined8 *)(lVar2 + 8));
    iVar5 = 1;
    while( true ) {
      iVar3 = XEventsQueued(*(undefined8 *)(lVar2 + 8),0);
      if (0 < iVar3) {
        XNextEvent(*(undefined8 *)(lVar2 + 8),&local_f0);
        processEvent((SWindowData *)window,&local_f0);
      }
      mVar1 = window[0x2a2];
      if (mVar1 == (mfb_window)0x1) {
        destroy_window_data((SWindowData *)window);
        goto LAB_001038c0;
      }
      dVar6 = mfb_timer_now(*(mfb_timer **)(lVar2 + 0x30));
      if (g_time_for_frame <= dVar6) break;
      if (g_time_for_frame * 0.8 <= dVar6) {
        iVar5 = 0;
      }
      usleep(iVar5 * 1000);
    }
    mfb_timer_reset(*(mfb_timer **)(lVar2 + 0x30));
LAB_001038c0:
    bVar4 = (byte)mVar1 ^ 1;
  }
  return (_Bool)bVar4;
}

Assistant:

bool 
mfb_wait_sync(struct mfb_window *window) {
    if (window == 0x0) {
        return STATE_INVALID_WINDOW;
    }

    SWindowData *window_data = (SWindowData *) window;
    if (window_data->close) {
        destroy_window_data(window_data);
        return false;
    }

    SWindowData_X11 *window_data_x11 = (SWindowData_X11 *) window_data->specific;
    XFlush(window_data_x11->display);
    XEvent      event;
    double      current;
    uint32_t    millis = 1;
    while(1) {
        if(XEventsQueued(window_data_x11->display, QueuedAlready) > 0) {
            XNextEvent(window_data_x11->display, &event);
            processEvent(window_data, &event);
        }
        
        if(window_data->close) {
            destroy_window_data(window_data);
            return false;
        }

        current = mfb_timer_now(window_data_x11->timer);
        if (current >= g_time_for_frame) {
            mfb_timer_reset(window_data_x11->timer);
            return true;
        }
        else if(current >= g_time_for_frame * 0.8) {
            millis = 0;
        }

        usleep(millis * 1000);
        //sched_yield();
    }
    
    return true;
}